

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O2

void anurbs::PolylineMapper<3L>::register_python(module *m)

{
  string name;
  class_<anurbs::PolylineMapper<3L>_> cStack_78;
  char *local_70 [4];
  arg local_50;
  arg local_40;
  code *local_30;
  undefined8 local_28;
  arg local_20;
  
  PolylineMapper<3l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::PolylineMapper<3L>_>::class_<>
            (&cStack_78,(m->super_object).super_handle.m_ptr,local_70[0]);
  local_20.name = "points";
  local_20._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<const_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_&>
  ::execute<pybind11::class_<anurbs::PolylineMapper<3L>_>,_pybind11::arg,_0>(&cStack_78,&local_20);
  local_30 = map;
  local_28 = 0;
  local_40.name = "point";
  local_40._8_1_ = 2;
  local_50.name = "tolerance";
  local_50._8_1_ = 2;
  pybind11::class_<anurbs::PolylineMapper<3l>>::
  def<std::tuple<double,long,double,long>(anurbs::PolylineMapper<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double),pybind11::arg,pybind11::arg>
            ((class_<anurbs::PolylineMapper<3l>> *)&cStack_78,"map",
             (offset_in_Model_to_subr *)&local_30,&local_40,&local_50);
  pybind11::object::~object((object *)&cStack_78);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<const std::vector<Vector>&>(), "points"_a)
            // methods
            .def("map", &Type::map, "point"_a, "tolerance"_a)
        ;
    }